

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::BeginColumns(char *str_id,int columns_count,ImGuiOldColumnFlags flags)

{
  ImRect *this;
  float fVar1;
  int iVar2;
  ImGuiWindow *window;
  ImGuiOldColumnData *pIVar3;
  ImGuiOldColumns *pIVar4;
  ImVec2 IVar5;
  ImGuiContext *pIVar6;
  ImGuiID id;
  ImGuiOldColumns *columns;
  ImGuiOldColumns *pIVar7;
  ImGuiOldColumnData *pIVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  ImGuiContext *g;
  ulong uVar14;
  bool bVar15;
  uint uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  
  pIVar6 = GImGui;
  GImGui->CurrentWindow->WriteAccessed = true;
  window = pIVar6->CurrentWindow;
  id = GetColumnsID(str_id,columns_count);
  pIVar7 = FindOrCreateColumns(window,id);
  pIVar7->Current = 0;
  pIVar7->Count = columns_count;
  pIVar7->Flags = flags;
  (window->DC).CurrentColumns = pIVar7;
  pIVar7->HostCursorPosY = (window->DC).CursorPos.y;
  pIVar7->HostCursorMaxPosX = (window->DC).CursorMaxPos.x;
  IVar5 = (window->ClipRect).Max;
  (pIVar7->HostInitialClipRect).Min = (window->ClipRect).Min;
  (pIVar7->HostInitialClipRect).Max = IVar5;
  IVar5 = (window->ParentWorkRect).Max;
  (pIVar7->HostBackupParentWorkRect).Min = (window->ParentWorkRect).Min;
  (pIVar7->HostBackupParentWorkRect).Max = IVar5;
  IVar5 = (window->WorkRect).Max;
  (window->ParentWorkRect).Min = (window->WorkRect).Min;
  (window->ParentWorkRect).Max = IVar5;
  fVar1 = (pIVar6->Style).ItemSpacing.x;
  fVar17 = (window->WindowPadding).x;
  fVar19 = fVar1 - fVar17;
  fVar17 = fVar17 * 0.5;
  uVar16 = -(uint)(window->WindowBorderSize <= fVar17);
  fVar18 = (window->WorkRect).Max.x;
  fVar19 = (float)(-(uint)(0.0 <= fVar19) & (uint)fVar19);
  fVar20 = (fVar1 + fVar18) - fVar19;
  fVar18 = (float)(int)(float)(~uVar16 & (uint)window->WindowBorderSize | (uint)fVar17 & uVar16) +
           fVar18;
  if (fVar18 <= fVar20) {
    fVar20 = fVar18;
  }
  fVar19 = ((window->DC).Indent.x - fVar1) + fVar19;
  pIVar7->OffMinX = fVar19;
  fVar20 = fVar20 - (window->Pos).x;
  fVar19 = fVar19 + 1.0;
  uVar16 = -(uint)(fVar19 <= fVar20);
  pIVar7->OffMaxX = (float)(~uVar16 & (uint)fVar19 | (uint)fVar20 & uVar16);
  fVar17 = (window->DC).CursorPos.y;
  pIVar7->LineMaxY = fVar17;
  pIVar7->LineMinY = fVar17;
  iVar13 = (pIVar7->Columns).Size;
  iVar10 = columns_count + 1;
  if (iVar13 != iVar10 && iVar13 != 0) {
    iVar13 = (pIVar7->Columns).Capacity;
    if (iVar13 < 0) {
      uVar16 = iVar13 / 2 + iVar13;
      uVar14 = 0;
      if (0 < (int)uVar16) {
        uVar14 = (ulong)uVar16;
      }
      pIVar8 = (ImGuiOldColumnData *)MemAlloc(uVar14 * 0x1c);
      pIVar3 = (pIVar7->Columns).Data;
      if (pIVar3 != (ImGuiOldColumnData *)0x0) {
        memcpy(pIVar8,pIVar3,(long)(pIVar7->Columns).Size * 0x1c);
        MemFree((pIVar7->Columns).Data);
      }
      (pIVar7->Columns).Data = pIVar8;
      (pIVar7->Columns).Capacity = (int)uVar14;
    }
    (pIVar7->Columns).Size = 0;
  }
  bVar15 = (pIVar7->Columns).Size == 0;
  pIVar7->IsFirstFrame = bVar15;
  if (bVar15) {
    if ((pIVar7->Columns).Capacity <= columns_count) {
      pIVar8 = (ImGuiOldColumnData *)MemAlloc((long)iVar10 * 0x1c);
      pIVar3 = (pIVar7->Columns).Data;
      if (pIVar3 != (ImGuiOldColumnData *)0x0) {
        memcpy(pIVar8,pIVar3,(long)(pIVar7->Columns).Size * 0x1c);
        MemFree((pIVar7->Columns).Data);
      }
      (pIVar7->Columns).Data = pIVar8;
      (pIVar7->Columns).Capacity = iVar10;
    }
    if (-1 < columns_count) {
      iVar13 = 0;
      do {
        iVar12 = (pIVar7->Columns).Size;
        iVar2 = (pIVar7->Columns).Capacity;
        if (iVar12 == iVar2) {
          if (iVar2 == 0) {
            iVar9 = 8;
          }
          else {
            iVar9 = iVar2 / 2 + iVar2;
          }
          iVar12 = iVar12 + 1;
          if (iVar12 < iVar9) {
            iVar12 = iVar9;
          }
          if (iVar2 < iVar12) {
            pIVar8 = (ImGuiOldColumnData *)MemAlloc((long)iVar12 * 0x1c);
            pIVar3 = (pIVar7->Columns).Data;
            if (pIVar3 != (ImGuiOldColumnData *)0x0) {
              memcpy(pIVar8,pIVar3,(long)(pIVar7->Columns).Size * 0x1c);
              MemFree((pIVar7->Columns).Data);
            }
            (pIVar7->Columns).Data = pIVar8;
            (pIVar7->Columns).Capacity = iVar12;
          }
        }
        pIVar3 = (pIVar7->Columns).Data;
        iVar12 = (pIVar7->Columns).Size;
        pIVar3[iVar12].OffsetNorm = (float)iVar13 / (float)columns_count;
        pIVar8 = pIVar3 + iVar12;
        pIVar8->OffsetNormBeforeResize = 0.0;
        pIVar8->Flags = 0;
        (((ImRect *)(&pIVar8->OffsetNormBeforeResize + 2))->Min).x = 0.0;
        (((ImRect *)(&pIVar8->OffsetNormBeforeResize + 2))->Min).y = 0.0;
        pIVar3[iVar12].ClipRect.Max.x = 0.0;
        pIVar3[iVar12].ClipRect.Max.y = 0.0;
        (pIVar7->Columns).Size = (pIVar7->Columns).Size + 1;
        iVar13 = iVar13 + 1;
      } while (iVar10 != iVar13);
    }
  }
  if (0 < columns_count) {
    lVar11 = 0;
    do {
      pIVar4 = (GImGui->CurrentWindow->DC).CurrentColumns;
      fVar17 = 0.0;
      fVar18 = 0.0;
      if (pIVar4 != (ImGuiOldColumns *)0x0) {
        fVar18 = (pIVar4->OffMaxX - pIVar4->OffMinX) *
                 *(float *)((long)&((pIVar4->Columns).Data)->OffsetNorm + lVar11) + pIVar4->OffMinX;
      }
      fVar20 = (window->Pos).x;
      if (pIVar4 != (ImGuiOldColumns *)0x0) {
        fVar17 = (pIVar4->OffMaxX - pIVar4->OffMinX) *
                 *(float *)((long)&(pIVar4->Columns).Data[1].OffsetNorm + lVar11) + pIVar4->OffMinX;
      }
      this = (ImRect *)((long)&(((pIVar7->Columns).Data)->ClipRect).Min.x + lVar11);
      (this->Min).x = (float)(int)(fVar18 + fVar20 + 0.5);
      (this->Min).y = -3.4028235e+38;
      (this->Max).x = (float)(int)(fVar20 + fVar17 + -1.0 + 0.5);
      (this->Max).y = 3.4028235e+38;
      ImRect::ClipWithFull(this,&window->ClipRect);
      lVar11 = lVar11 + 0x1c;
    } while ((ulong)(uint)columns_count * 0x1c != lVar11);
  }
  if (1 < pIVar7->Count) {
    ImDrawListSplitter::Split(&pIVar7->Splitter,window->DrawList,pIVar7->Count + 1);
    ImDrawListSplitter::SetCurrentChannel(&pIVar7->Splitter,window->DrawList,1);
    pIVar3 = (((GImGui->CurrentWindow->DC).CurrentColumns)->Columns).Data;
    PushClipRect(&(pIVar3->ClipRect).Min,&(pIVar3->ClipRect).Max,false);
  }
  iVar13 = pIVar7->Current;
  pIVar7 = (GImGui->CurrentWindow->DC).CurrentColumns;
  fVar18 = 0.0;
  fVar17 = 0.0;
  if (pIVar7 != (ImGuiOldColumns *)0x0) {
    iVar10 = iVar13;
    if (iVar13 < 0) {
      iVar10 = pIVar7->Current;
    }
    fVar17 = (pIVar7->OffMaxX - pIVar7->OffMinX) * (pIVar7->Columns).Data[iVar10].OffsetNorm +
             pIVar7->OffMinX;
  }
  if (pIVar7 != (ImGuiOldColumns *)0x0) {
    if (iVar13 < -1) {
      iVar13 = pIVar7->Current;
    }
    else {
      iVar13 = iVar13 + 1;
    }
    fVar18 = (pIVar7->OffMaxX - pIVar7->OffMinX) * (pIVar7->Columns).Data[iVar13].OffsetNorm +
             pIVar7->OffMinX;
  }
  PushItemWidth((fVar18 - fVar17) * 0.65);
  fVar20 = fVar1 - (window->WindowPadding).x;
  fVar20 = (float)(-(uint)(0.0 <= fVar20) & (uint)fVar20);
  (window->DC).ColumnsOffset.x = fVar20;
  fVar17 = (window->Pos).x;
  (window->DC).CursorPos.x = (float)(int)((window->DC).Indent.x + fVar17 + fVar20);
  (window->WorkRect).Max.x = (fVar18 + fVar17) - fVar1;
  return;
}

Assistant:

void ImGui::BeginColumns(const char* str_id, int columns_count, ImGuiOldColumnFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    IM_ASSERT(columns_count >= 1);
    IM_ASSERT(window->DC.CurrentColumns == NULL);   // Nested columns are currently not supported

    // Acquire storage for the columns set
    ImGuiID id = GetColumnsID(str_id, columns_count);
    ImGuiOldColumns* columns = FindOrCreateColumns(window, id);
    IM_ASSERT(columns->ID == id);
    columns->Current = 0;
    columns->Count = columns_count;
    columns->Flags = flags;
    window->DC.CurrentColumns = columns;

    columns->HostCursorPosY = window->DC.CursorPos.y;
    columns->HostCursorMaxPosX = window->DC.CursorMaxPos.x;
    columns->HostInitialClipRect = window->ClipRect;
    columns->HostBackupParentWorkRect = window->ParentWorkRect;
    window->ParentWorkRect = window->WorkRect;

    // Set state for first column
    // We aim so that the right-most column will have the same clipping width as other after being clipped by parent ClipRect
    const float column_padding = g.Style.ItemSpacing.x;
    const float half_clip_extend_x = ImFloor(ImMax(window->WindowPadding.x * 0.5f, window->WindowBorderSize));
    const float max_1 = window->WorkRect.Max.x + column_padding - ImMax(column_padding - window->WindowPadding.x, 0.0f);
    const float max_2 = window->WorkRect.Max.x + half_clip_extend_x;
    columns->OffMinX = window->DC.Indent.x - column_padding + ImMax(column_padding - window->WindowPadding.x, 0.0f);
    columns->OffMaxX = ImMax(ImMin(max_1, max_2) - window->Pos.x, columns->OffMinX + 1.0f);
    columns->LineMinY = columns->LineMaxY = window->DC.CursorPos.y;

    // Clear data if columns count changed
    if (columns->Columns.Size != 0 && columns->Columns.Size != columns_count + 1)
        columns->Columns.resize(0);

    // Initialize default widths
    columns->IsFirstFrame = (columns->Columns.Size == 0);
    if (columns->Columns.Size == 0)
    {
        columns->Columns.reserve(columns_count + 1);
        for (int n = 0; n < columns_count + 1; n++)
        {
            ImGuiOldColumnData column;
            column.OffsetNorm = n / (float)columns_count;
            columns->Columns.push_back(column);
        }
    }

    for (int n = 0; n < columns_count; n++)
    {
        // Compute clipping rectangle
        ImGuiOldColumnData* column = &columns->Columns[n];
        float clip_x1 = IM_ROUND(window->Pos.x + GetColumnOffset(n));
        float clip_x2 = IM_ROUND(window->Pos.x + GetColumnOffset(n + 1) - 1.0f);
        column->ClipRect = ImRect(clip_x1, -FLT_MAX, clip_x2, +FLT_MAX);
        column->ClipRect.ClipWithFull(window->ClipRect);
    }

    if (columns->Count > 1)
    {
        columns->Splitter.Split(window->DrawList, 1 + columns->Count);
        columns->Splitter.SetCurrentChannel(window->DrawList, 1);
        PushColumnClipRect(0);
    }

    // We don't generally store Indent.x inside ColumnsOffset because it may be manipulated by the user.
    float offset_0 = GetColumnOffset(columns->Current);
    float offset_1 = GetColumnOffset(columns->Current + 1);
    float width = offset_1 - offset_0;
    PushItemWidth(width * 0.65f);
    window->DC.ColumnsOffset.x = ImMax(column_padding - window->WindowPadding.x, 0.0f);
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
    window->WorkRect.Max.x = window->Pos.x + offset_1 - column_padding;
}